

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte *pbVar1;
  byte bVar2;
  void *pvVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  SMDImporter *this_00;
  int iTime;
  byte *apbStack_120 [2];
  ulong local_110;
  vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_> *local_108;
  char **local_100;
  Face local_f8;
  
  local_108 = &this->asTriangles;
  local_110 = 0;
  local_100 = szCurrentOut;
  do {
    this->iLineNumber = this->iLineNumber + 1;
    while (((ulong)(byte)*szCurrent < 0x21 &&
           ((0x100002600U >> ((ulong)(byte)*szCurrent & 0x3f) & 1) != 0))) {
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    apbStack_120[1] = (byte *)szCurrent;
    if (*szCurrent == 0) goto LAB_0060d61d;
    iVar6 = (byte)*szCurrent - 0x65;
    if ((iVar6 == 0) && (iVar6 = ((byte *)szCurrent)[1] - 0x6e, iVar6 == 0)) {
      iVar6 = 100 - (uint)((byte *)szCurrent)[2];
    }
    else {
      iVar6 = -iVar6;
    }
    if (iVar6 == 0) {
      bVar2 = ((byte *)szCurrent)[3];
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = (byte *)szCurrent + (4 - (ulong)(bVar2 == 0));
LAB_0060d61d:
        if (((int)local_110 != 2) &&
           ((this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          apbStack_120[0] = (byte *)0x60d63e;
          std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::pop_back(local_108);
        }
        this->iLineNumber = this->iLineNumber + 1;
        while (((ulong)*apbStack_120[1] < 0x21 &&
               ((0x100002600U >> ((ulong)*apbStack_120[1] & 0x3f) & 1) != 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        *local_100 = (char *)apbStack_120[1];
        return;
      }
    }
    this_00 = (SMDImporter *)0x6d8b98;
    apbStack_120[0] = (byte *)0x60d4ac;
    iVar6 = strncmp("time",szCurrent,4);
    if (iVar6 == 0) {
      bVar2 = ((byte *)szCurrent)[4];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_0060d544;
      apbStack_120[1] = (byte *)szCurrent + 5;
      if (bVar2 == 0) {
        apbStack_120[1] = (byte *)szCurrent + 4;
      }
      local_f8.iTexture = 0;
      apbStack_120[0] = (byte *)0x60d4f3;
      bVar5 = ParseSignedInt(this_00,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                             (int *)&local_f8);
      if ((!bVar5) ||
         (szCurrent = (char *)apbStack_120[1], this->configFrameID != local_f8.iTexture))
      goto LAB_0060d61d;
      while( true ) {
        bVar2 = *szCurrent;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        szCurrent = (char *)((byte *)szCurrent + 1);
      }
      while ((bVar2 == 0xd || (bVar2 == 10))) {
        pbVar1 = (byte *)szCurrent + 1;
        szCurrent = (char *)((byte *)szCurrent + 1);
        bVar2 = *pbVar1;
      }
      this->iLineNumber = this->iLineNumber + 1;
    }
    else {
LAB_0060d544:
      iVar6 = (int)local_110;
      if (iVar6 == 0) {
        local_f8.iTexture = 0;
        lVar7 = 0x30;
        do {
          *(undefined8 *)((long)&local_110 + lVar7) = 0;
          *(undefined8 *)((long)&local_108 + lVar7) = 0;
          *(undefined8 *)((long)apbStack_120 + lVar7) = 0;
          *(undefined8 *)((long)apbStack_120 + lVar7 + 8) = 0;
          *(undefined8 *)((long)local_f8.avVertices + lVar7 + -0x10) = 0xffffffff00000000;
          *(undefined8 *)((long)local_f8.avVertices + lVar7 + -8) = 0;
          *(undefined8 *)((long)&local_f8.avVertices[0].pos.x + lVar7) = 0;
          *(undefined8 *)((long)&local_f8.avVertices[0].pos.z + lVar7) = 0;
          lVar7 = lVar7 + 0x40;
        } while (lVar7 != 0xf0);
        apbStack_120[0] = (byte *)0x60d59f;
        std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
        emplace_back<Assimp::SMD::Face>(local_108,&local_f8);
        lVar7 = 0xc0;
        do {
          pvVar3 = *(void **)((long)&local_108 + lVar7);
          if (pvVar3 != (void *)0x0) {
            apbStack_120[0] = (byte *)0x60d5bc;
            operator_delete(pvVar3,*(long *)((long)local_f8.avVertices + lVar7 + -8) - (long)pvVar3)
            ;
          }
          lVar7 = lVar7 + -0x40;
        } while (lVar7 != 0);
        iVar6 = (int)local_110;
        szCurrent = (char *)apbStack_120[1];
      }
      uVar4 = iVar6 + 1U;
      if (iVar6 + 1U == 3) {
        uVar4 = 0;
      }
      local_110 = (ulong)uVar4;
      apbStack_120[0] = (byte *)0x60d606;
      ParseVertex(this,szCurrent,(char **)(apbStack_120 + 1),
                  (Vertex *)
                  ((long)(this->asTriangles).
                         super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish + local_110 * 0x40 + -0xc0),true)
      ;
      szCurrent = (char *)apbStack_120[1];
    }
  } while( true );
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}